

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

double TTA::Alloc(uint max_length,PerformanceEvaluator *perf)

{
  double dVar1;
  double dVar2;
  uint *__s;
  uint *__s_00;
  uint *__s_01;
  ulong __n;
  
  PerformanceEvaluator::start(perf);
  __n = (ulong)max_length << 2;
  __s = (uint *)operator_new__(__n);
  rtable_ = __s;
  __s_00 = (uint *)operator_new__(__n);
  next_ = __s_00;
  __s_01 = (uint *)operator_new__(__n);
  tail_ = __s_01;
  memset(__s,0,__n);
  memset(__s_00,0,__n);
  memset(__s_01,0,__n);
  PerformanceEvaluator::stop(perf);
  dVar1 = (perf->counter_).last;
  dVar2 = perf->tick_frequency_;
  PerformanceEvaluator::start(perf);
  memset(rtable_,0,__n);
  memset(next_,0,__n);
  memset(tail_,0,__n);
  PerformanceEvaluator::stop(perf);
  return (dVar1 * 1000.0) / dVar2 - ((perf->counter_).last * 1000.0) / perf->tick_frequency_;
}

Assistant:

static double Alloc(unsigned max_length, PerformanceEvaluator& perf) {
        perf.start();
        rtable_ = new unsigned[max_length];
        next_ = new unsigned[max_length];
        tail_ = new unsigned[max_length];
        memset(rtable_, 0, max_length * sizeof(unsigned));
        memset(next_, 0, max_length * sizeof(unsigned));
        memset(tail_, 0, max_length * sizeof(unsigned));
        perf.stop();
        double t = perf.last();
        perf.start();
        memset(rtable_, 0, max_length * sizeof(unsigned));
        memset(next_, 0, max_length * sizeof(unsigned));
        memset(tail_, 0, max_length * sizeof(unsigned));
        perf.stop();
        return t - perf.last();
    }